

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

void __thiscall
absl::lts_20240722::Cord::ChunkIterator::AdvanceBytesBtree(ChunkIterator *this,size_t n)

{
  size_t *psVar1;
  CordRepBtreeReader *this_00;
  ulong uVar2;
  size_t sVar3;
  string_view sVar4;
  
  uVar2 = (this->current_chunk_)._M_len;
  if (uVar2 <= n) {
    psVar1 = &this->bytes_remaining_;
    *psVar1 = *psVar1 - n;
    if (*psVar1 == 0) {
      (this->current_chunk_)._M_len = 0;
      (this->current_chunk_)._M_str = (char *)0x0;
    }
    else {
      this_00 = &this->btree_reader_;
      if (uVar2 == n) {
        sVar4 = cord_internal::CordRepBtreeReader::Next(this_00);
      }
      else {
        sVar3 = cord_internal::CordRepBtreeReader::length(this_00);
        sVar4 = cord_internal::CordRepBtreeReader::Seek(this_00,sVar3 - this->bytes_remaining_);
      }
      this->current_chunk_ = sVar4;
    }
    return;
  }
  __assert_fail("n >= current_chunk_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.h"
                ,0x60a,"void absl::Cord::ChunkIterator::AdvanceBytesBtree(size_t)");
}

Assistant:

~Cord() {
    if (contents_.is_tree()) DestroyCordSlow();
  }